

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint countZeros(uchar *data,size_t size,size_t pos)

{
  uchar *puVar1;
  bool bVar2;
  uchar *local_30;
  uchar *end;
  uchar *start;
  size_t pos_local;
  size_t size_local;
  uchar *data_local;
  
  puVar1 = data + pos;
  local_30 = puVar1 + 0x102;
  size_local = (size_t)puVar1;
  if (data + size < local_30) {
    local_30 = data + size;
  }
  while( true ) {
    bVar2 = false;
    if ((uchar *)size_local != local_30) {
      bVar2 = *(char *)size_local == '\0';
    }
    if (!bVar2) break;
    size_local = size_local + 1;
  }
  return (int)size_local - (int)puVar1;
}

Assistant:

static unsigned countZeros(const unsigned char* data, size_t size, size_t pos)
{
  const unsigned char* start = data + pos;
  const unsigned char* end = start + MAX_SUPPORTED_DEFLATE_LENGTH;
  if(end > data + size) end = data + size;
  data = start;
  while(data != end && *data == 0) ++data;
  /*subtracting two addresses returned as 32-bit number (max value is MAX_SUPPORTED_DEFLATE_LENGTH)*/
  return (unsigned)(data - start);
}